

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_diag_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  parasail_result_t *ppVar13;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  bool bVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  ulong uVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  ulong uVar44;
  ulong uVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  __m128i_64_t B_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int64_t iVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  long lVar58;
  __m128i_64_t B_2;
  long lVar60;
  undefined1 auVar59 [16];
  long lVar61;
  long lVar63;
  undefined1 auVar62 [16];
  __m128i_64_t B_1;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  __m128i_64_t B_5;
  __m128i_64_t B;
  ulong uVar70;
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 in_XMM14 [16];
  undefined1 in_XMM15 [16];
  __m128i_64_t B_6;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  undefined1 local_468 [16];
  ulong local_458;
  ulong local_428;
  ulong local_410;
  undefined1 local_3f8 [16];
  ulong local_3b8;
  ulong uStack_3b0;
  ulong uStack_3a0;
  undefined1 local_388 [16];
  ulong uStack_370;
  undefined1 local_358 [16];
  ulong local_348;
  ulong uStack_340;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  ulong local_288 [10];
  undefined1 local_238 [16];
  ulong local_228 [6];
  undefined1 local_1f8 [16];
  ulong local_1e0;
  long local_1d8;
  int *local_1d0;
  long local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined8 local_178;
  ulong uStack_170;
  ulong local_168;
  undefined8 uStack_160;
  long local_158;
  long lStack_150;
  long local_148;
  long lStack_140;
  undefined1 local_138 [16];
  int local_128;
  undefined4 uStack_124;
  int iStack_120;
  undefined4 uStack_11c;
  long local_118;
  long lStack_110;
  ulong local_108;
  ulong uStack_100;
  undefined1 local_f8 [16];
  long local_e8;
  long lStack_e0;
  long local_d8;
  long lStack_d0;
  long local_c8;
  long lStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  ulong local_88;
  long lStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long lVar64;
  long lVar67;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_stats_diag_sse41_128_64_cold_8();
  }
  else {
    uVar31 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sg_flags_stats_diag_sse41_128_64_cold_7();
    }
    else if (open < 0) {
      parasail_sg_flags_stats_diag_sse41_128_64_cold_6();
    }
    else if (gap < 0) {
      parasail_sg_flags_stats_diag_sse41_128_64_cold_5();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sg_flags_stats_diag_sse41_128_64_cold_4();
    }
    else {
      if (matrix->type == 1) {
        if (_s1 == (char *)0x0) {
          parasail_sg_flags_stats_diag_sse41_128_64_cold_3();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        if (_s1 == (char *)0x0) {
          parasail_sg_flags_stats_diag_sse41_128_64_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sg_flags_stats_diag_sse41_128_64_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      if (matrix->type != 0) {
        _s1Len = matrix->length;
      }
      uVar12 = _s1Len - 1;
      iVar30 = s2Len + -1;
      iVar20 = matrix->min;
      iVar27 = -open;
      uVar17 = 0x8000000000000000 - (long)iVar20;
      if (iVar20 != iVar27 && SBORROW4(iVar20,iVar27) == iVar20 + open < 0) {
        uVar17 = (ulong)(uint)open | 0x8000000000000000;
      }
      uVar15 = uVar17 + 1;
      uVar21 = 0x7ffffffffffffffe - (long)matrix->max;
      auVar34._8_4_ = (int)uVar15;
      auVar34._0_8_ = uVar15;
      auVar34._12_4_ = (int)(uVar15 >> 0x20);
      uVar22 = (ulong)_s1Len;
      lVar1 = uVar22 - 1;
      lVar2 = uVar31 - 1;
      local_1b8 = (undefined1  [16])0x0;
      local_388 = (undefined1  [16])0x0;
      if (s1_beg == 0) {
        local_1b8._4_4_ = 0;
        local_1b8._0_4_ = gap * 2;
        local_1b8._8_4_ = gap * 2;
        local_1b8._12_4_ = 0;
      }
      uStack_3a0 = auVar34._8_8_;
      local_1f8._8_8_ = uStack_3a0;
      local_1f8._0_8_ = uVar15;
      local_228[5] = uStack_3a0;
      local_228[3] = uStack_3a0;
      local_228[1] = uStack_3a0;
      local_238._8_8_ = uStack_3a0;
      local_238._0_8_ = uVar15;
      local_288[9] = uStack_3a0;
      local_288[7] = uStack_3a0;
      local_288[5] = uStack_3a0;
      local_288[3] = uStack_3a0;
      local_288[1] = uStack_3a0;
      local_298._8_8_ = uStack_3a0;
      local_298._0_8_ = uVar15;
      local_2a8._8_8_ = uStack_3a0;
      local_2a8._0_8_ = uVar15;
      local_358._8_8_ = uStack_3a0;
      local_358._0_8_ = uVar15;
      local_2b8._8_8_ = uStack_3a0;
      local_2b8._0_8_ = uVar15;
      if (s1_beg == 0) {
        local_388._8_8_ = (long)iVar27;
        local_388._0_8_ = (long)(iVar27 - gap);
      }
      local_288[0] = uVar15;
      local_288[2] = uVar15;
      local_288[4] = uVar15;
      local_288[6] = uVar15;
      local_288[8] = uVar15;
      local_228[0] = uVar15;
      local_228[2] = uVar15;
      local_228[4] = uVar15;
      ppVar13 = parasail_result_new_stats();
      if (ppVar13 != (parasail_result_t *)0x0) {
        ppVar13->flag =
             (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
             (uint)(s2_end != 0) << 0xf | ppVar13->flag | 0x2811002;
        local_1e0 = uVar17;
        ptr = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
        uVar17 = (ulong)(s2Len + 2);
        ptr_00 = parasail_memalign_int64_t(0x10,uVar17);
        ptr_01 = parasail_memalign_int64_t(0x10,uVar17);
        ptr_02 = parasail_memalign_int64_t(0x10,uVar17);
        ptr_03 = parasail_memalign_int64_t(0x10,uVar17);
        ptr_04 = parasail_memalign_int64_t(0x10,uVar17);
        ptr_05 = parasail_memalign_int64_t(0x10,uVar17);
        ptr_06 = parasail_memalign_int64_t(0x10,uVar17);
        ptr_07 = parasail_memalign_int64_t(0x10,uVar17);
        ptr_08 = parasail_memalign_int64_t(0x10,uVar17);
        if ((ptr_08 != (int64_t *)0x0 &&
            (ptr_07 != (int64_t *)0x0 && (ptr_06 != (int64_t *)0x0 && ptr_05 != (int64_t *)0x0))) &&
            ((ptr_04 != (int64_t *)0x0 && (ptr_03 != (int64_t *)0x0 && ptr_02 != (int64_t *)0x0)) &&
            ((ptr_01 != (int64_t *)0x0 && ptr_00 != (int64_t *)0x0) && ptr != (int64_t *)0x0))) {
          if (0 < _s1Len) {
            piVar3 = matrix->mapper;
            uVar17 = 0;
            do {
              ptr[uVar17] = (long)piVar3[(byte)_s1[uVar17]];
              uVar17 = uVar17 + 1;
            } while (uVar22 != uVar17);
          }
          local_348 = uVar21;
          uStack_340 = uVar21;
          local_128 = open;
          uStack_124 = 0;
          iStack_120 = open;
          uStack_11c = 0;
          local_138._0_8_ = CONCAT44(0,gap);
          local_138._8_4_ = gap;
          local_138._12_4_ = 0;
          auVar11 = local_138;
          local_158 = lVar1;
          lStack_150 = lVar1;
          local_148 = lVar2;
          lStack_140 = lVar2;
          ptr[uVar22] = 0;
          piVar3 = matrix->mapper;
          uVar17 = 1;
          if (1 < s2Len) {
            uVar17 = uVar31;
          }
          uVar23 = 0;
          do {
            ptr_00[uVar23 + 1] = (long)piVar3[(byte)_s2[uVar23]];
            uVar23 = uVar23 + 1;
          } while (uVar17 != uVar23);
          *ptr_00 = 0;
          ptr_00[uVar31 + 1] = 0;
          local_1c8 = (long)iVar27;
          if (s2_beg == 0) {
            uVar17 = 1;
            if (1 < s2Len) {
              uVar17 = uVar31;
            }
            lVar25 = 0;
            lVar24 = local_1c8;
            do {
              *(long *)((long)ptr_01 + lVar25 + 8) = lVar24;
              *(undefined8 *)((long)ptr_02 + lVar25 + 8) = 0;
              *(undefined8 *)((long)ptr_03 + lVar25 + 8) = 0;
              *(undefined8 *)((long)ptr_04 + lVar25 + 8) = 0;
              *(ulong *)((long)ptr_05 + lVar25 + 8) = uVar15;
              *(undefined8 *)((long)ptr_06 + lVar25 + 8) = 0;
              *(undefined8 *)((long)ptr_07 + lVar25 + 8) = 0;
              *(undefined8 *)((long)ptr_08 + lVar25 + 8) = 0;
              lVar24 = lVar24 - (ulong)(uint)gap;
              lVar25 = lVar25 + 8;
            } while (uVar17 * 8 != lVar25);
          }
          else {
            lVar24 = 0;
            do {
              *(undefined8 *)((long)ptr_01 + lVar24 + 8) = 0;
              *(undefined8 *)((long)ptr_02 + lVar24 + 8) = 0;
              *(undefined8 *)((long)ptr_03 + lVar24 + 8) = 0;
              *(undefined8 *)((long)ptr_04 + lVar24 + 8) = 0;
              *(ulong *)((long)ptr_05 + lVar24 + 8) = uVar15;
              *(undefined8 *)((long)ptr_06 + lVar24 + 8) = 0;
              *(undefined8 *)((long)ptr_07 + lVar24 + 8) = 0;
              *(undefined8 *)((long)ptr_08 + lVar24 + 8) = 0;
              lVar24 = lVar24 + 8;
            } while (uVar17 * 8 != lVar24);
          }
          *ptr_01 = 0;
          *ptr_02 = 0;
          *ptr_03 = 0;
          *ptr_04 = 0;
          *ptr_05 = 0;
          *ptr_06 = 0;
          *ptr_07 = 0;
          *ptr_08 = 0;
          ptr_01[uVar31 + 1] = 0;
          ptr_02[uVar31 + 1] = 0;
          ptr_03[uVar31 + 1] = 0;
          ptr_04[uVar31 + 1] = 0;
          ptr_05[uVar31 + 1] = 0;
          ptr_06[uVar31 + 1] = 0;
          ptr_07[uVar31 + 1] = 0;
          ptr_08[uVar31 + 1] = 0;
          *ptr_01 = 0;
          local_338._8_8_ = local_228[5];
          local_338._0_8_ = local_228[4];
          local_328._8_8_ = local_228[3];
          local_328._0_8_ = local_228[2];
          local_318._8_8_ = local_228[1];
          local_318._0_8_ = local_228[0];
          local_308._8_8_ = local_288[9];
          local_308._0_8_ = local_288[8];
          local_2f8._8_8_ = local_288[7];
          local_2f8._0_8_ = local_288[6];
          local_2e8._8_8_ = local_288[5];
          local_2e8._0_8_ = local_288[4];
          local_2d8._8_8_ = local_288[3];
          local_2d8._0_8_ = local_288[2];
          local_2c8._8_8_ = local_288[1];
          local_2c8._0_8_ = local_288[0];
          local_3b8 = uVar15;
          if (_s1Len < 1) {
            uStack_3b0 = uStack_3a0;
          }
          else {
            local_1d0 = matrix->matrix;
            local_1d8 = (long)matrix->size;
            iVar20 = matrix->type;
            local_168 = uStack_3a0;
            uStack_160 = 0;
            auVar74 = pmovsxbq(in_XMM15,1);
            local_1c0 = 0;
            uStack_3b0 = uStack_3a0;
            do {
              local_f8 = auVar74;
              uVar14 = (uint)local_1c0;
              uVar16 = uVar14 | 1;
              if (uVar22 <= (local_1c0 | 1)) {
                uVar16 = uVar12;
              }
              bVar32 = iVar20 == 0;
              uStack_100 = ptr[local_1c0];
              uVar17 = local_1c0;
              if (bVar32) {
                uVar17 = uStack_100;
              }
              local_108 = ptr[local_1c0 + 1];
              uVar23 = (long)(int)uVar16;
              if (bVar32) {
                uVar23 = local_108;
              }
              lVar24 = auVar74._0_8_;
              lVar25 = auVar74._8_8_;
              local_1c0 = local_1c0 + 2;
              iVar19 = iVar27 - uVar14 * gap;
              if (s1_beg != 0) {
                iVar19 = 0;
              }
              auVar73._8_8_ = (long)iVar19;
              auVar73._0_8_ = uStack_3a0;
              local_118 = -(ulong)(lVar24 < (long)uVar22);
              lStack_110 = -(ulong)(lVar25 < (long)uVar22);
              iVar54 = *ptr_01;
              *ptr_01 = local_1c8 - local_1c0 * (uint)gap;
              auVar71 = (undefined1  [16])0x0;
              uVar18 = 0;
              uStack_370 = uStack_3a0;
              in_XMM14 = pmovsxbq(in_XMM14,0xff);
              auVar41 = (undefined1  [16])0x0;
              local_188 = (undefined1  [16])0x0;
              local_198 = (undefined1  [16])0x0;
              uStack_170 = uStack_3a0;
              auVar59 = ZEXT816(0);
              auVar68 = ZEXT816(0);
              local_3f8._8_8_ = uStack_3a0;
              local_3f8._0_8_ = uVar15;
              local_468 = ZEXT816(0);
              auVar56 = (undefined1  [16])0x0;
              local_1a8 = ZEXT816(0);
              uVar40 = uStack_3a0;
              lVar64 = 0;
              lVar67 = 0;
              lVar58 = 0;
              lVar60 = 0;
              lVar61 = 0;
              lVar63 = 0;
              local_178 = uVar15;
              do {
                local_78 = local_298;
                local_68 = local_2a8;
                local_58 = local_358;
                local_48 = local_2b8;
                local_88 = auVar73._8_8_;
                local_d8 = lVar61;
                lStack_d0 = lVar63;
                local_b8._0_8_ = local_1a8._8_8_;
                iVar4 = ptr_02[uVar18 + 1];
                local_b8._8_8_ = iVar4;
                local_e8 = lVar58;
                lStack_e0 = lVar60;
                local_a8._0_8_ = auVar56._8_8_;
                iVar5 = ptr_03[uVar18 + 1];
                local_a8._8_8_ = iVar5;
                local_c8 = lVar64;
                lStack_c0 = lVar67;
                iVar6 = ptr_04[uVar18 + 1];
                local_98._8_8_ = iVar6;
                local_98._0_8_ = local_468._8_8_;
                auVar62._8_8_ = ptr_06[uVar18 + 1];
                auVar62._0_8_ = local_198._8_8_;
                auVar75._8_8_ = ptr_07[uVar18 + 1];
                auVar75._0_8_ = local_188._8_8_;
                lStack_80 = ptr_01[uVar18 + 1];
                uVar39 = local_88 - (uint)open;
                uVar44 = ptr_01[uVar18 + 1] - (ulong)(uint)open;
                local_138._12_4_ = 0;
                uVar33 = CONCAT44(local_178._4_4_,(undefined4)uStack_170) - local_138._0_8_;
                uVar38 = ptr_05[uVar18 + 1] - local_138._8_8_;
                local_178 = uVar33;
                if ((long)uVar33 < (long)uVar39) {
                  local_178 = uVar39;
                }
                uStack_170 = uVar38;
                if ((long)uVar38 < (long)uVar44) {
                  uStack_170 = uVar44;
                }
                auVar35._8_8_ = -(ulong)((long)uVar38 < (long)uVar44);
                auVar35._0_8_ = -(ulong)((long)uVar33 < (long)uVar39);
                local_198 = pblendvb(auVar62,local_b8,auVar35);
                local_188 = pblendvb(auVar75,local_a8,auVar35);
                uVar44 = auVar73._0_8_ - (ulong)(uint)open;
                uVar70 = local_88 - (uint)open;
                uVar38 = local_3f8._0_8_ - local_138._0_8_;
                uVar39 = local_3f8._8_8_ - local_138._8_8_;
                uVar33 = uVar38;
                if ((long)uVar38 < (long)uVar44) {
                  uVar33 = uVar44;
                }
                uVar29 = uVar39;
                if ((long)uVar39 < (long)uVar70) {
                  uVar29 = uVar70;
                }
                uVar7 = ptr_00[uVar18 + 1];
                auVar72._0_8_ = auVar71._8_8_;
                auVar72._8_8_ = ptr_08[uVar18 + 1];
                uVar40 = (long)local_1d0[uVar23 * local_1d8 + ptr_00[uVar18]] + uVar40;
                uVar45 = local_1d0[uVar17 * local_1d8 + uVar7] + iVar54;
                auVar73 = pblendvb(auVar72,local_98,auVar35);
                uVar26 = uVar33;
                if ((long)uVar33 < (long)uVar40) {
                  uVar26 = uVar40;
                }
                uVar28 = uVar29;
                if ((long)uVar29 < (long)uVar45) {
                  uVar28 = uVar45;
                }
                auVar46._8_8_ = -(ulong)((long)uVar39 < (long)uVar70);
                auVar46._0_8_ = -(ulong)((long)uVar38 < (long)uVar44);
                auVar41 = pblendvb(auVar41,local_1a8,auVar46);
                if ((long)uVar26 <= (long)local_178) {
                  uVar26 = local_178;
                }
                if ((long)uVar28 <= (long)uStack_170) {
                  uVar28 = uStack_170;
                }
                auVar68 = pblendvb(auVar68,auVar56,auVar46);
                auVar65._0_8_ =
                     (ulong)(0 < (long)local_1d0[uVar23 * local_1d8 + ptr_00[uVar18]]) + lVar58;
                auVar65._8_8_ = (ulong)(0 < (long)local_1d0[uVar17 * local_1d8 + uVar7]) + lVar60;
                auVar62 = pblendvb(auVar59,local_468,auVar46);
                auVar69._8_8_ = uVar28;
                auVar69._0_8_ = uVar26;
                auVar47._0_8_ = -(ulong)(uVar26 == local_178);
                auVar47._8_8_ = -(ulong)(uVar28 == uStack_170);
                auVar59 = blendvpd(auVar41,local_198,auVar47);
                auVar42._0_8_ = -(ulong)(uVar40 == uVar26);
                auVar42._8_8_ = -(ulong)(uVar45 == uVar28);
                auVar56._0_8_ = lVar61 + (ulong)(local_108 == uStack_370);
                auVar56._8_8_ = lVar63 + (ulong)(uStack_100 == uVar7);
                local_1a8 = blendvpd(auVar59,auVar56,auVar42);
                auVar56 = blendvpd(auVar68,local_188,auVar47);
                auVar56 = blendvpd(auVar56,auVar65,auVar42);
                auVar57._8_4_ = 0xffffffff;
                auVar57._0_8_ = 0xffffffffffffffff;
                auVar57._12_4_ = 0xffffffff;
                auVar71._0_8_ = auVar73._0_8_ + 1;
                lVar58 = auVar57._8_8_;
                auVar71._8_8_ = auVar73._8_8_ - lVar58;
                auVar59._0_8_ = auVar62._0_8_ + 1;
                auVar59._8_8_ = auVar62._8_8_ - lVar58;
                auVar73 = blendvpd(auVar59,auVar71,auVar47);
                auVar48._0_8_ = lVar64 + 1;
                auVar48._8_8_ = lVar67 - lVar58;
                auVar62 = blendvpd(auVar73,auVar48,auVar42);
                auVar50._8_8_ = uVar29;
                auVar50._0_8_ = uVar33;
                lVar64 = in_XMM14._0_8_;
                lVar67 = in_XMM14._8_8_;
                auVar66._0_8_ = -(ulong)(lVar64 == -1);
                auVar66._8_8_ = -(ulong)(lVar67 == lVar58);
                auVar73 = blendvpd(auVar69,local_388,auVar66);
                local_1a8 = ~auVar66 & local_1a8;
                auVar56 = ~auVar66 & auVar56;
                auVar62 = ~auVar66 & auVar62;
                local_3f8 = blendvpd(auVar50,auVar34,auVar66);
                auVar51._8_4_ = 0xffffffff;
                auVar51._0_8_ = 0xffffffffffffffff;
                auVar51._12_4_ = 0xffffffff;
                uVar40 = auVar73._0_8_;
                uVar38 = auVar56._0_8_;
                uVar39 = auVar62._0_8_;
                uVar33 = local_1a8._0_8_;
                uVar44 = auVar73._8_8_;
                if (1 < uVar18) {
                  if ((long)uVar40 <= (long)local_348) {
                    local_348 = uVar40;
                  }
                  if ((long)uVar44 <= (long)uStack_340) {
                    uStack_340 = uVar44;
                  }
                  uVar70 = uVar40;
                  if ((long)uVar40 < (long)local_3b8) {
                    uVar70 = local_3b8;
                  }
                  uVar29 = uVar44;
                  if ((long)uVar44 < (long)uStack_3b0) {
                    uVar29 = uStack_3b0;
                  }
                  if ((long)uVar70 <= (long)uVar33) {
                    uVar70 = uVar33;
                  }
                  if ((long)uVar29 <= (long)local_1a8._8_8_) {
                    uVar29 = local_1a8._8_8_;
                  }
                  if ((long)uVar70 <= (long)uVar38) {
                    uVar70 = uVar38;
                  }
                  if ((long)uVar29 <= (long)auVar56._8_8_) {
                    uVar29 = auVar56._8_8_;
                  }
                  local_3b8 = uVar70;
                  if ((long)uVar70 <= (long)uVar39) {
                    local_3b8 = uVar39;
                  }
                  uStack_3b0 = uVar29;
                  if ((long)uVar29 <= (long)auVar62._8_8_) {
                    uStack_3b0 = auVar62._8_8_;
                  }
                }
                ptr_01[uVar18] = uVar40;
                ptr_02[uVar18] = uVar33;
                ptr_03[uVar18] = uVar38;
                ptr_04[uVar18] = uVar39;
                ptr_05[uVar18] = local_178;
                ptr_06[uVar18] = local_198._0_8_;
                ptr_07[uVar18] = local_188._0_8_;
                ptr_08[uVar18] = auVar71._0_8_;
                auVar49._0_8_ = -(ulong)(lVar64 == lVar2);
                auVar49._8_8_ = -(ulong)(lVar67 == lVar2);
                auVar36._0_8_ = -(ulong)(SUB168(in_XMM14 ^ auVar51,0) < 0);
                auVar36._8_8_ = -(ulong)(SUB168(in_XMM14 ^ auVar51,8) < 0);
                auVar52._8_8_ = -(ulong)(lVar67 < (long)uVar31);
                auVar52._0_8_ = -(ulong)(lVar64 < (long)uVar31);
                auVar8._8_8_ = -(ulong)(lVar25 == lVar1);
                auVar8._0_8_ = -(ulong)(lVar24 == lVar1);
                auVar43._0_8_ = -(ulong)(local_1f8._0_8_ < (long)uVar40);
                auVar43._8_8_ = -(ulong)(local_1f8._8_8_ < (long)uVar44);
                uVar14 = movmskpd(in_XMM14._8_4_,auVar43);
                auVar53._8_8_ = -(ulong)(byte)((byte)uVar14 >> 1);
                auVar53._0_8_ = -(ulong)(uVar14 & 1);
                auVar53 = auVar53 & auVar36 & auVar8 & auVar52;
                auVar37._0_8_ = -(ulong)(local_238._0_8_ < (long)uVar40);
                auVar37._8_8_ = -(ulong)(local_238._8_8_ < (long)uVar44);
                uVar14 = movmskpd((int)-(ulong)(uVar14 & 1),auVar37);
                auVar55._8_8_ = -(ulong)(byte)((byte)uVar14 >> 1);
                auVar55._0_8_ = -(ulong)(uVar14 & 1);
                local_1f8 = pblendvb(local_1f8,auVar73,auVar53);
                local_338 = pblendvb(local_338,local_1a8,auVar53);
                local_328 = pblendvb(local_328,auVar56,auVar53);
                auVar10._8_8_ = -(ulong)(lVar25 < (long)uVar22);
                auVar10._0_8_ = -(ulong)(lVar24 < (long)uVar22);
                auVar55 = auVar55 & auVar49 & auVar10;
                local_318 = pblendvb(local_318,auVar62,auVar53);
                local_238 = pblendvb(local_238,auVar73,auVar55);
                auVar41 = ~auVar66 & auVar41;
                local_308 = pblendvb(local_308,local_1a8,auVar55);
                local_2f8 = pblendvb(local_2f8,auVar56,auVar55);
                auVar68 = ~auVar66 & auVar68;
                local_2e8 = pblendvb(local_2e8,auVar62,auVar55);
                auVar9._8_8_ = -(ulong)(lVar25 == lVar1);
                auVar9._0_8_ = -(ulong)(lVar24 == lVar1);
                auVar49 = auVar49 & auVar9;
                local_2d8 = blendvpd(local_2d8,auVar73,auVar49);
                auVar59 = ~auVar66 & auVar59;
                local_2c8 = blendvpd(local_2c8,local_1a8,auVar49);
                local_298 = blendvpd(local_298,auVar56,auVar49);
                local_2a8 = blendvpd(local_2a8,auVar62,auVar49);
                local_358 = pblendvb(local_358,auVar74,auVar55);
                local_2b8 = pblendvb(local_2b8,in_XMM14,auVar53);
                in_XMM14._0_8_ = lVar64 + 1;
                in_XMM14._8_8_ = lVar67 + 1;
                uVar18 = uVar18 + 1;
                uVar40 = local_88;
                iVar54 = lStack_80;
                lVar64 = local_468._8_8_;
                lVar67 = iVar6;
                lVar58 = local_a8._0_8_;
                lVar60 = iVar5;
                lVar61 = local_b8._0_8_;
                lVar63 = iVar4;
                local_468 = auVar62;
                uStack_370 = uVar7;
              } while (s2Len + 1 != uVar18);
              auVar74._0_8_ = lVar24 + 2;
              auVar74._8_8_ = lVar25 + 2;
              local_388._8_8_ = local_388._8_8_ - local_1b8._8_8_;
              local_388._0_8_ = local_388._0_8_ - local_1b8._0_8_;
            } while (local_1c0 < uVar22);
          }
          local_228[4] = local_338._0_8_;
          local_228[5] = local_338._8_8_;
          local_228[2] = local_328._0_8_;
          local_228[3] = local_328._8_8_;
          local_228[0] = local_318._0_8_;
          local_228[1] = local_318._8_8_;
          local_288[8] = local_308._0_8_;
          local_288[9] = local_308._8_8_;
          local_288[6] = local_2f8._0_8_;
          local_288[7] = local_2f8._8_8_;
          local_288[4] = local_2e8._0_8_;
          local_288[5] = local_2e8._8_8_;
          local_288[2] = local_2d8._0_8_;
          local_288[3] = local_2d8._8_8_;
          local_288[0] = local_2c8._0_8_;
          local_288[1] = local_2c8._8_8_;
          lVar24 = 0;
          uVar23 = uVar15;
          uVar22 = uVar15;
          uVar40 = uVar15;
          uVar18 = uVar15;
          uVar33 = uVar15;
          uVar17 = uVar15;
          uVar31 = uVar15;
          uVar14 = uVar12;
          iVar20 = iVar30;
          local_410 = uVar15;
          local_458 = uVar15;
          local_428 = uVar15;
          local_468._0_8_ = uVar15;
          do {
            uVar38 = *(ulong *)(local_238 + lVar24);
            if (((long)uVar18 < (long)uVar38) ||
               ((uVar38 == uVar18 && (*(long *)(local_358 + lVar24) < (long)(int)uVar14)))) {
              uVar14 = *(uint *)(local_358 + lVar24);
              local_458 = *(ulong *)((long)local_288 + lVar24 + 0x40);
              uVar31 = *(ulong *)((long)local_288 + lVar24 + 0x30);
              uVar17 = *(ulong *)((long)local_288 + lVar24 + 0x20);
              uVar18 = uVar38;
            }
            iVar19 = (int)uVar17;
            iVar27 = (int)uVar31;
            if ((long)uVar33 < (long)*(ulong *)(local_1f8 + lVar24)) {
              iVar20 = *(int *)(local_2b8 + lVar24);
              local_428 = *(ulong *)((long)local_228 + lVar24 + 0x20);
              local_468._0_8_ = *(ulong *)((long)local_228 + lVar24 + 0x10);
              uVar15 = *(ulong *)((long)local_228 + lVar24);
              uVar33 = *(ulong *)(local_1f8 + lVar24);
            }
            uVar38 = *(ulong *)((long)local_288 + lVar24 + 0x10);
            if ((long)uVar40 < (long)uVar38) {
              uVar22 = *(ulong *)((long)local_288 + lVar24);
              uVar23 = *(ulong *)(local_298 + lVar24);
              local_410 = *(ulong *)(local_2a8 + lVar24);
              uVar40 = uVar38;
            }
            lVar24 = lVar24 + 8;
          } while ((int)lVar24 == 8);
          if (s1_end == 0 || s2_end == 0) {
            if ((s1_end == 0) &&
               (uVar18 = uVar40, uVar14 = uVar12, iVar27 = (int)uVar23, iVar19 = (int)local_410,
               local_458._0_4_ = (int)uVar22, s2_end != 0)) {
              uVar18 = uVar33;
              iVar30 = iVar20;
              iVar27 = (int)local_468._0_8_;
              iVar19 = (int)uVar15;
              local_458._0_4_ = (int)local_428;
            }
          }
          else if (((long)uVar18 <= (long)uVar33) && ((uVar18 != uVar33 || (iVar20 != iVar30)))) {
            uVar18 = uVar33;
            uVar14 = uVar12;
            iVar30 = iVar20;
            iVar27 = (int)local_468._0_8_;
            iVar19 = (int)uVar15;
            local_458._0_4_ = (int)local_428;
          }
          iVar20 = (int)uVar18;
          auVar41._8_8_ = -(ulong)((long)uStack_340 <= (long)local_1e0);
          auVar41._0_8_ = -(ulong)((long)local_348 <= (long)local_1e0);
          auVar68._8_8_ = -(ulong)((long)uVar21 < (long)uStack_3b0);
          auVar68._0_8_ = -(ulong)((long)uVar21 < (long)local_3b8);
          auVar68 = auVar68 | auVar41;
          if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar68 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar68 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar68 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar68 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar68 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar68 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar68 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar68 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar68 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar68 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar68 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar68[0xf] < '\0') {
            *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
            iVar19 = 0;
            iVar27 = 0;
            local_458._0_4_ = 0;
            iVar20 = 0;
            iVar30 = 0;
            uVar14 = 0;
          }
          ppVar13->score = iVar20;
          ppVar13->end_query = uVar14;
          ppVar13->end_ref = iVar30;
          ((ppVar13->field_4).stats)->matches = (int)local_458;
          ((ppVar13->field_4).stats)->similar = iVar27;
          ((ppVar13->field_4).stats)->length = iVar19;
          local_138 = auVar11;
          parasail_free(ptr_08);
          parasail_free(ptr_07);
          parasail_free(ptr_06);
          parasail_free(ptr_05);
          parasail_free(ptr_04);
          parasail_free(ptr_03);
          parasail_free(ptr_02);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          return ppVar13;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxMRow;
    __m128i vMaxSRow;
    __m128i vMaxLRow;
    __m128i vMaxHCol;
    __m128i vMaxMCol;
    __m128i vMaxSCol;
    __m128i vMaxLCol;
    __m128i vLastValH;
    __m128i vLastValM;
    __m128i vLastValS;
    __m128i vLastValL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxHRow = vNegInf;
    vMaxMRow = vNegInf;
    vMaxSRow = vNegInf;
    vMaxLRow = vNegInf;
    vMaxHCol = vNegInf;
    vMaxMCol = vNegInf;
    vMaxSCol = vNegInf;
    vMaxLCol = vNegInf;
    vLastValH = vNegInf;
    vLastValM = vNegInf;
    vLastValS = vNegInf;
    vLastValL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            HM_pr[j] = 0;
            HS_pr[j] = 0;
            HL_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
            FM_pr[j] = 0;
            FS_pr[j] = 0;
            FL_pr[j] = 0;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            HM_pr[j] = 0;
            HS_pr[j] = 0;
            HL_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
            FM_pr[j] = 0;
            FS_pr[j] = 0;
            FL_pr[j] = 0;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vNegInf;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi64(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 8);
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_srli_si128(vWH, 8);
        vWH = _mm_insert_epi64_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi64(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi64_rpl(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi64_rpl(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi64_rpl(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi64_rpl(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxMRow = _mm_blendv_epi8(vMaxMRow, vWM, cond_all_row);
                vMaxSRow = _mm_blendv_epi8(vMaxSRow, vWS, cond_all_row);
                vMaxLRow = _mm_blendv_epi8(vMaxLRow, vWL, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vMaxMCol = _mm_blendv_epi8(vMaxMCol, vWM, cond_all_col);
                vMaxSCol = _mm_blendv_epi8(vMaxSCol, vWS, cond_all_col);
                vMaxLCol = _mm_blendv_epi8(vMaxLCol, vWL, cond_all_col);
                vLastValH = _mm_blendv_epi8(vLastValH, vWH, cond_last_val);
                vLastValM = _mm_blendv_epi8(vLastValM, vWM, cond_last_val);
                vLastValS = _mm_blendv_epi8(vLastValS, vWS, cond_last_val);
                vLastValL = _mm_blendv_epi8(vLastValL, vWL, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int64_t max_rowh = NEG_LIMIT;
        int64_t max_rowm = NEG_LIMIT;
        int64_t max_rows = NEG_LIMIT;
        int64_t max_rowl = NEG_LIMIT;
        int64_t max_colh = NEG_LIMIT;
        int64_t max_colm = NEG_LIMIT;
        int64_t max_cols = NEG_LIMIT;
        int64_t max_coll = NEG_LIMIT;
        int64_t last_valh = NEG_LIMIT;
        int64_t last_valm = NEG_LIMIT;
        int64_t last_vals = NEG_LIMIT;
        int64_t last_vall = NEG_LIMIT;
        int64_t *rh = (int64_t*)&vMaxHRow;
        int64_t *rm = (int64_t*)&vMaxMRow;
        int64_t *rs = (int64_t*)&vMaxSRow;
        int64_t *rl = (int64_t*)&vMaxLRow;
        int64_t *ch = (int64_t*)&vMaxHCol;
        int64_t *cm = (int64_t*)&vMaxMCol;
        int64_t *cs = (int64_t*)&vMaxSCol;
        int64_t *cl = (int64_t*)&vMaxLCol;
        int64_t *lh = (int64_t*)&vLastValH;
        int64_t *lm = (int64_t*)&vLastValM;
        int64_t *ls = (int64_t*)&vLastValS;
        int64_t *ll = (int64_t*)&vLastValL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++rh, ++rm, ++rs, ++rl, ++ch, ++cm, ++cs, ++cl, ++lh, ++lm, ++ls, ++ll, ++i, ++j) {
            if (*ch > max_colh || (*ch == max_colh && *i < end_query)) {
                max_colh = *ch;
                end_query = *i;
                max_colm = *cm;
                max_cols = *cs;
                max_coll = *cl;
            }
            if (*rh > max_rowh) {
                max_rowh = *rh;
                end_ref = *j;
                max_rowm = *rm;
                max_rows = *rs;
                max_rowl = *rl;
            }
            if (*lh > last_valh) {
                last_valh = *lh;
                last_valm = *lm;
                last_vals = *ls;
                last_vall = *ll;
            }
        }
        if (s1_end && s2_end) {
            if (max_colh > max_rowh || (max_colh == max_rowh && end_ref == s2Len-1)) {
                score = max_colh;
                end_ref = s2Len-1;
                matches = max_colm;
                similar = max_cols;
                length = max_coll;
            }
            else {
                score = max_rowh;
                end_query = s1Len-1;
                matches = max_rowm;
                similar = max_rows;
                length = max_rowl;
            }
        }
        else if (s1_end) {
            score = max_colh;
            end_ref = s2Len-1;
            matches = max_colm;
            similar = max_cols;
            length = max_coll;
        }
        else if (s2_end) {
            score = max_rowh;
            end_query = s1Len-1;
            matches = max_rowm;
            similar = max_rows;
            length = max_rowl;
        }
        else {
            score = last_valh;
            end_query = s1Len-1;
            end_ref = s2Len-1;
            matches = last_valm;
            similar = last_vals;
            length = last_vall;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}